

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall re2::RE2::RE2(RE2 *this,char *pattern)

{
  StringPiece *in_RDI;
  Options *in_stack_00000470;
  StringPiece *in_stack_00000478;
  RE2 *in_stack_00000480;
  StringPiece *this_00;
  Options local_48 [3];
  
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  Options::Options((Options *)(this_00 + 2));
  std::__cxx11::string::string((string *)&in_RDI[3].size_);
  std::__cxx11::string::string((string *)&in_RDI[9].size_);
  std::once_flag::once_flag((once_flag *)&in_RDI[0xc].size_);
  std::once_flag::once_flag((once_flag *)((long)&in_RDI[0xc].size_ + 4));
  std::once_flag::once_flag((once_flag *)(in_RDI + 0xd));
  StringPiece::StringPiece(this_00,(char *)in_RDI);
  Options::Options(local_48,DefaultOptions);
  Init(in_stack_00000480,in_stack_00000478,in_stack_00000470);
  return;
}

Assistant:

RE2::RE2(const char* pattern) {
  Init(pattern, DefaultOptions);
}